

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O1

green_loop_t green_loop_init(void)

{
  green_loop_t pgVar1;
  
  pgVar1 = (green_loop_t)green_malloc(0x3e0);
  pgVar1->refs = 1;
  pgVar1->coroutines = 0;
  pgVar1->nextcoroid = 1;
  pgVar1->currentcoro = (green_coroutine_t)0x0;
  return pgVar1;
}

Assistant:

green_loop_t green_loop_init()
{
    green_loop_t loop = green_malloc(sizeof(struct green_loop));
    loop->refs = 1;
    loop->coroutines = 0;
    loop->nextcoroid = 1;
    loop->currentcoro = NULL;

    return loop;
}